

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

bool __thiscall
llama_kv_cache_unified::state_read_meta
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count,
          llama_seq_id dest_seq_id)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  uint32_t cell_id;
  uint uVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  uint uVar12;
  undefined8 uVar13;
  ulong uVar14;
  bool bVar15;
  llama_pos pos;
  uint32_t n_seq_id;
  llama_ubatch batch;
  llama_sbatch sbatch;
  llama_seq_id local_194;
  llama_kv_cache_unified *local_190;
  int local_184;
  ulong local_180;
  int local_174;
  ulong local_170;
  llama_ubatch local_168;
  llama_sbatch local_128;
  
  uVar11 = (ulong)cell_count;
  local_194 = dest_seq_id;
  local_190 = this;
  local_180 = uVar11;
  if (dest_seq_id == -1) {
    if (this->size < cell_count) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: not enough cells in kv cache\n","state_read_meta"
                        );
      return false;
    }
    (**(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i)();
    bVar3 = cell_count != 0;
    if (bVar3) {
      uVar14 = 0;
      local_170 = uVar11;
      do {
        plVar1 = (local_190->cells).
                 super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*io->_vptr_llama_io_read_i[3])(io,&local_128,4);
        (*io->_vptr_llama_io_read_i[3])(io,&local_168,4);
        plVar1[uVar14].pos = (llama_pos)local_128.n_tokens;
        bVar15 = local_168._0_4_ != 0;
        if (bVar15) {
          uVar12 = 0;
          do {
            (*io->_vptr_llama_io_read_i[3])(io,&local_184,4);
            if (local_184 < 0) {
              llama_log_internal(GGML_LOG_LEVEL_ERROR,
                                 "%s: invalid seq_id, %d is out of range [0, inf)\n",
                                 "state_read_meta");
LAB_001b1829:
              if (bVar15) {
                if (bVar3) {
                  return false;
                }
                goto LAB_001b1840;
              }
              break;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &plVar1[uVar14].seq_id,&local_184);
            if (local_190->recurrent == true) {
              lVar7 = (long)local_184;
              plVar2 = (local_190->cells).
                       super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar4 = plVar2[lVar7].tail;
              if (uVar4 != 0xffffffff) {
                llama_log_internal(GGML_LOG_LEVEL_ERROR,
                                   "%s: duplicate tail for seq_id %d in cell %d and %d\n",
                                   "state_read_meta",lVar7,uVar14 & 0xffffffff,(ulong)uVar4);
                goto LAB_001b1829;
              }
              plVar2[lVar7].tail = (int32_t)uVar14;
            }
            uVar12 = uVar12 + 1;
            bVar15 = uVar12 < (uint)local_168._0_4_;
          } while (bVar15);
        }
        uVar14 = uVar14 + 1;
        bVar3 = uVar14 < local_170;
      } while (uVar14 != local_170);
    }
LAB_001b1840:
    local_190->head = 0;
    uVar12 = (uint)local_180;
    local_190->used = uVar12;
LAB_001b1850:
    if ((uVar12 != 0) && (local_190->recurrent != false)) {
      uVar4 = local_190->head;
      plVar1 = (local_190->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ulong)uVar12;
      do {
        plVar1[uVar4].src = uVar4;
        uVar4 = uVar4 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    return true;
  }
  (*(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[2])
            (this,(ulong)(uint)dest_seq_id,0xffffffff);
  memset(&local_128.ids,0,0xe0);
  llama_sbatch::reserve_ubatch(&local_168,&local_128,uVar11,false);
  local_168.n_tokens = (uint32_t)local_180;
  local_168.n_seqs = 1;
  local_168.n_seq_tokens = local_168.n_tokens;
  if (local_168.n_tokens != 0) {
    uVar14 = 0;
    do {
      (*io->_vptr_llama_io_read_i[3])(io,&local_184,4);
      (*io->_vptr_llama_io_read_i[3])(io,&local_174,4);
      if (local_174 != 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid seq_id-agnostic kv cell\n",
                           "state_read_meta");
        goto LAB_001b16e2;
      }
      local_168.pos[uVar14] = local_184;
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  *local_168.n_seq_id = 1;
  *local_168.seq_id = &local_194;
  bVar3 = find_slot(local_190,&local_168);
  if (!bVar3) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to find available cells in kv cache\n",
                       "state_read_meta");
LAB_001b16e2:
    llama_sbatch::~llama_sbatch(&local_128);
    return false;
  }
  (*(local_190->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[10])();
  uVar4 = local_190->head;
  uVar12 = (uint)local_180;
  if (local_190->size < uVar4 + uVar12) {
    pcVar8 = "head + cell_count <= size";
    uVar13 = 0x449;
  }
  else {
    plVar1 = (local_190->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (plVar1[uVar4].pos == *local_168.pos) {
      uVar9 = (uVar4 + uVar12) - 1;
      if (plVar1[uVar9].pos == local_168.pos[uVar12 - 1]) {
        p_Var5 = &plVar1[uVar4].seq_id._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = plVar1[uVar4].seq_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var5->_M_header;
        for (; p_Var10 != (_Base_ptr)0x0;
            p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < local_194]) {
          if (local_194 <= (int)p_Var10[1]._M_color) {
            p_Var6 = p_Var10;
          }
        }
        p_Var10 = &p_Var5->_M_header;
        if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
           (p_Var10 = p_Var6, local_194 < (int)p_Var6[1]._M_color)) {
          p_Var10 = &p_Var5->_M_header;
        }
        if ((_Rb_tree_header *)p_Var10 == p_Var5) {
          pcVar8 = "cells[head].has_seq_id(dest_seq_id)";
          uVar13 = 0x44c;
        }
        else {
          p_Var5 = &plVar1[uVar9].seq_id._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = plVar1[uVar9].seq_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 = &p_Var5->_M_header;
          for (; p_Var10 != (_Base_ptr)0x0;
              p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < local_194]) {
            if (local_194 <= (int)p_Var10[1]._M_color) {
              p_Var6 = p_Var10;
            }
          }
          p_Var10 = &p_Var5->_M_header;
          if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
             (p_Var10 = p_Var6, local_194 < (int)p_Var6[1]._M_color)) {
            p_Var10 = &p_Var5->_M_header;
          }
          if ((_Rb_tree_header *)p_Var10 != p_Var5) {
            llama_sbatch::~llama_sbatch(&local_128);
            goto LAB_001b1850;
          }
          pcVar8 = "cells[head + cell_count - 1].has_seq_id(dest_seq_id)";
          uVar13 = 0x44d;
        }
      }
      else {
        pcVar8 = "cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]";
        uVar13 = 1099;
      }
    }
    else {
      pcVar8 = "cells[head].pos == batch.pos[0]";
      uVar13 = 0x44a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar13,"GGML_ASSERT(%s) failed",pcVar8);
}

Assistant:

bool llama_kv_cache_unified::state_read_meta(llama_io_read_i & io, uint32_t cell_count, llama_seq_id dest_seq_id) {
    if (dest_seq_id != -1) {
        // single sequence

        seq_rm(dest_seq_id, -1, -1);

        llama_sbatch sbatch;
        llama_ubatch batch = sbatch.reserve_ubatch(cell_count, /* has_embd */ false);

        batch.n_tokens = cell_count;
        batch.n_seq_tokens = cell_count;
        batch.n_seqs = 1;

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_pos pos;
            uint32_t n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            if (n_seq_id != 0) {
                LLAMA_LOG_ERROR("%s: invalid seq_id-agnostic kv cell\n", __func__);
                return false;
            }

            batch.pos[i] = pos;
        }
        batch.n_seq_id[0] = 1;
        batch.seq_id[0] = &dest_seq_id;
        if (!find_slot(batch)) {
            LLAMA_LOG_ERROR("%s: failed to find available cells in kv cache\n", __func__);
            return false;
        }
        commit();

        // DEBUG CHECK: kv.head should be our first cell, kv.head + cell_count - 1 should be our last cell (verify seq_id and pos values)
        // Assume that this is one contiguous block of cells
        GGML_ASSERT(head + cell_count <= size);
        GGML_ASSERT(cells[head].pos == batch.pos[0]);
        GGML_ASSERT(cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]);
        GGML_ASSERT(cells[head].has_seq_id(dest_seq_id));
        GGML_ASSERT(cells[head + cell_count - 1].has_seq_id(dest_seq_id));
    } else {
        // whole KV cache restore

        if (cell_count > size) {
            LLAMA_LOG_ERROR("%s: not enough cells in kv cache\n", __func__);
            return false;
        }

        clear();

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_kv_cell & cell = cells[i];

            llama_pos pos;
            uint32_t  n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            cell.pos = pos;

            for (uint32_t j = 0; j < n_seq_id; ++j) {
                llama_seq_id seq_id;
                io.read_to(&seq_id, sizeof(seq_id));

                // TODO: llama_kv_cache_unified should have a notion of max sequences
                //if (seq_id < 0 || (uint32_t) seq_id >= llama_n_seq_max(ctx)) {
                if (seq_id < 0) {
                    //LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, %u)\n", __func__, seq_id, llama_n_seq_max(ctx));
                    LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, inf)\n", __func__, seq_id);
                    return false;
                }

                cell.seq_id.insert(seq_id);

                if (recurrent) {
                    int32_t & tail = cells[seq_id].tail;
                    if (tail != -1) {
                        LLAMA_LOG_ERROR("%s: duplicate tail for seq_id %d in cell %d and %d\n", __func__, seq_id, i, tail);
                        return false;
                    }
                    tail = i;
                }
            }
        }

        head = 0;
        used = cell_count;
    }

    if (recurrent) {
        for (uint32_t i = 0; i < cell_count; ++i) {
            uint32_t cell_id = head + i;
            // make sure the recurrent states will keep their restored state
            cells[cell_id].src = cell_id;
        }
    }

    return true;
}